

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfuturewatcher.cpp
# Opt level: O1

bool __thiscall QFutureWatcherBase::event(QFutureWatcherBase *this,QEvent *event)

{
  bool bVar1;
  
  if (event->t == 0xb4) {
    QFutureWatcherBasePrivate::sendCallOutEvent
              ((QFutureWatcherBasePrivate *)(this->super_QObject).d_ptr.d,
               (QFutureCallOutEvent *)event);
    return true;
  }
  bVar1 = QObject::event(&this->super_QObject,event);
  return bVar1;
}

Assistant:

bool QFutureWatcherBase::event(QEvent *event)
{
    Q_D(QFutureWatcherBase);
    if (event->type() == QEvent::FutureCallOut) {
        QFutureCallOutEvent *callOutEvent = static_cast<QFutureCallOutEvent *>(event);
        d->sendCallOutEvent(callOutEvent);
        return true;
    }
    return QObject::event(event);
}